

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O0

int gdGetIntLSB(int *result,gdIOCtx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint r;
  int c;
  gdIOCtx *ctx_local;
  int *result_local;
  
  iVar1 = (*ctx->getC)(ctx);
  if (iVar1 == -1) {
    result_local._4_4_ = 0;
  }
  else {
    iVar2 = (*ctx->getC)(ctx);
    if (iVar2 == -1) {
      result_local._4_4_ = 0;
    }
    else {
      iVar3 = (*ctx->getC)(ctx);
      if (iVar3 == -1) {
        result_local._4_4_ = 0;
      }
      else {
        iVar4 = (*ctx->getC)(ctx);
        if (iVar4 == -1) {
          result_local._4_4_ = 0;
        }
        else {
          if (result != (int *)0x0) {
            *result = iVar4 << 0x18 |
                      (iVar3 << 0x18 | (iVar2 << 0x18 | (uint)(iVar1 << 0x18) >> 8) >> 8) >> 8;
          }
          result_local._4_4_ = 1;
        }
      }
    }
  }
  return result_local._4_4_;
}

Assistant:

int gdGetIntLSB(signed int *result, gdIOCtx *ctx)
{
	int c = 0;
	unsigned int r = 0;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);
	r >>= 8;

	c = (ctx->getC) (ctx);
	if (c == EOF) {
		return 0;
	}
	r |= (c << 24);

	if (result) {
		*result = (signed int)r;
	}

	return 1;
}